

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

Am_Value * __thiscall Am_Value::operator=(Am_Value *this,char in_value)

{
  if (((short)this->type < 0) && ((this->value).wrapper_value != (Am_Wrapper *)0x0)) {
    Am_Wrapper::Release((this->value).wrapper_value);
  }
  this->type = 7;
  (this->value).wrapper_value = (Am_Wrapper *)0x0;
  (this->value).char_value = in_value;
  return this;
}

Assistant:

Am_Value &
Am_Value::operator=(char in_value)
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  type = Am_CHAR;
  value.long_value = 0; // clear value first!!!
  value.char_value = in_value;
  return *this;
}